

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O3

void __thiscall QSystemTrayIconSys::paintEvent(QSystemTrayIconSys *this,QPaintEvent *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QPainter painter;
  undefined1 local_40 [8];
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  uVar1 = *(undefined8 *)(*(long *)(this + 0x20) + 0x1c);
  uVar2 = *(undefined8 *)(*(long *)(this + 0x20) + 0x14);
  local_28 = CONCAT44((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20),
                      (int)uVar1 - (int)uVar2);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_38,(QPaintDevice *)(this + 0x10));
  QSystemTrayIcon::icon((QSystemTrayIcon *)local_40);
  QIcon::paint((QSystemTrayIcon *)local_40,(QPainter *)&local_38,&local_30,0x84,0,1);
  QIcon::~QIcon((QIcon *)local_40);
  QPainter::~QPainter((QPainter *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconSys::paintEvent(QPaintEvent *)
{
    const QRect rect(QPoint(0, 0), geometry().size());
    QPainter painter(this);

    q->icon().paint(&painter, rect);
}